

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O2

void drawDetermineContainedTiles
               (IceTInt *contained_viewport,IceTDouble znear,IceTDouble zfar,IceTInt *contained_list
               ,IceTBoolean *contained_mask,IceTInt *num_contained_p)

{
  IceTInt *pIVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  IceTInt num_tiles;
  IceTDouble local_58;
  IceTDouble local_48;
  
  local_58 = zfar;
  local_48 = znear;
  pIVar1 = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x10,&num_tiles);
  *num_contained_p = 0;
  uVar4 = 0;
  memset(contained_mask,0,(long)num_tiles);
  uVar2 = 0;
  if (0 < num_tiles) {
    uVar2 = (ulong)(uint)num_tiles;
  }
  piVar3 = pIVar1 + 3;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    if ((double)local_48 <= 1.0 && -1.0 <= (double)local_58) {
      if ((*contained_viewport < piVar3[-1] + piVar3[-3]) &&
         (piVar3[-3] < *contained_viewport + contained_viewport[2])) {
        if ((contained_viewport[1] < *piVar3 + piVar3[-2]) &&
           (piVar3[-2] < contained_viewport[1] + contained_viewport[3])) {
          contained_list[*num_contained_p] = (IceTInt)uVar4;
          contained_mask[uVar4] = '\x01';
          *num_contained_p = *num_contained_p + 1;
        }
      }
    }
    piVar3 = piVar3 + 4;
  }
  return;
}

Assistant:

static void drawDetermineContainedTiles(const IceTInt contained_viewport[4],
                                        IceTDouble znear, IceTDouble zfar,
                                        IceTInt *contained_list,
                                        IceTBoolean *contained_mask,
                                        IceTInt *num_contained_p)
{
    const IceTInt *tile_viewports;
    IceTInt num_tiles;
    int i;

    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);

    *num_contained_p = 0;
    memset(contained_mask, 0, sizeof(IceTBoolean)*num_tiles);
    for (i = 0; i < num_tiles; i++) {
        if (   (znear  <= 1.0)
            && (zfar   >= -1.0)
            && (  contained_viewport[0]
                < tile_viewports[i*4+0] + tile_viewports[i*4+2])
            && (  contained_viewport[0] + contained_viewport[2]
                > tile_viewports[i*4+0])
            && (  contained_viewport[1]
                < tile_viewports[i*4+1] + tile_viewports[i*4+3])
            && (  contained_viewport[1] + contained_viewport[3]
                > tile_viewports[i*4+1]) ) {
            contained_list[*num_contained_p] = i;
            contained_mask[i] = 1;
            (*num_contained_p)++;
        }
    }
}